

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

ModuleData * FindModuleWithSourceLocation(ExpressionContext *ctx,char *position)

{
  ByteCode *code;
  char *pcVar1;
  ulong uVar2;
  
  if ((ctx->imports).count != 0) {
    uVar2 = 0;
    do {
      code = (ctx->imports).data[uVar2]->bytecode;
      pcVar1 = FindSource(code);
      if ((pcVar1 <= position) && (position <= pcVar1 + code->sourceSize)) {
        if ((ctx->imports).count <= (uint)uVar2) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<ModuleData *, 128>::operator[](unsigned int) [T = ModuleData *, N = 128]"
                       );
        }
        return (ctx->imports).data[uVar2];
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ctx->imports).count);
  }
  return (ModuleData *)0x0;
}

Assistant:

ModuleData* FindModuleWithSourceLocation(ExpressionContext &ctx, const char *position)
{
	for(unsigned i = 0; i < ctx.imports.size(); i++)
	{
		if(HasSourceCode(ctx.imports[i]->bytecode, position))
			return ctx.imports[i];
	}

	return NULL;
}